

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectGlow.cpp
# Opt level: O0

bool __thiscall
Rml::FontEffectGlow::Initialise
          (FontEffectGlow *this,int _width_outline,int _width_blur,Vector2i _offset)

{
  float *pfVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float local_78;
  int local_64;
  int x_2;
  float weight_1;
  int x_1;
  Vector2i local_50;
  float local_48;
  float local_44;
  float sum_weight;
  float gain;
  float two_variance;
  float std_dev;
  float distance;
  float weight;
  int y;
  int x;
  int _width_blur_local;
  int _width_outline_local;
  FontEffectGlow *this_local;
  Vector2i _offset_local;
  
  if ((_width_outline < 0) || (_width_blur < 0)) {
    _offset_local.x._3_1_ = false;
  }
  else {
    this->width_outline = _width_outline;
    this->width_blur = _width_blur;
    this->combined_width = this->width_blur + this->width_outline;
    this->offset = _offset;
    y = _width_blur;
    x = _width_outline;
    __width_blur_local = this;
    unique0x100005da = _offset;
    ConvolutionFilter::Initialise(&this->filter_outline,this->width_outline,Dilation);
    for (weight = (float)-this->width_outline; (int)weight <= this->width_outline;
        weight = (float)((int)weight + 1)) {
      for (distance = (float)-this->width_outline; (int)distance <= this->width_outline;
          distance = (float)((int)distance + 1)) {
        std_dev = 1.0;
        two_variance = Math::SquareRoot((float)((int)weight * (int)weight +
                                               (int)distance * (int)distance));
        if ((float)this->width_outline < two_variance) {
          std_dev = (float)(this->width_outline + 1) - two_variance;
          std_dev = Math::Max<float>(std_dev,0.0);
        }
        fVar4 = std_dev;
        pfVar1 = ConvolutionFilter::operator[]
                           (&this->filter_outline,(int)weight + this->width_outline);
        pfVar1[(int)distance + this->width_outline] = fVar4;
      }
    }
    if (this->width_blur == 0) {
      local_78 = 1.0;
    }
    else {
      local_78 = (float)this->width_blur * 0.4;
    }
    gain = local_78;
    sum_weight = local_78 * 2.0 * local_78;
    local_44 = Math::SquareRoot(sum_weight * 3.1415927);
    local_44 = 1.0 / local_44;
    local_48 = 0.0;
    Vector2<int>::Vector2(&local_50,this->width_blur,0);
    ConvolutionFilter::Initialise(&this->filter_blur_x,local_50,Sum);
    Vector2<int>::Vector2((Vector2<int> *)&weight_1,0,this->width_blur);
    ConvolutionFilter::Initialise(&this->filter_blur_y,_weight_1,Sum);
    for (x_2 = -this->width_blur; fVar4 = local_44, x_2 <= this->width_blur; x_2 = x_2 + 1) {
      fVar3 = Math::SquareRoot((float)(x_2 * x_2) / sum_weight);
      fVar3 = Math::Exp(-fVar3);
      fVar4 = fVar4 * fVar3;
      pfVar1 = ConvolutionFilter::operator[](&this->filter_blur_x,0);
      pfVar1[x_2 + this->width_blur] = fVar4;
      pfVar1 = ConvolutionFilter::operator[](&this->filter_blur_y,x_2 + this->width_blur);
      *pfVar1 = fVar4;
      local_48 = fVar4 + local_48;
    }
    for (local_64 = -this->width_blur; fVar4 = local_48, local_64 <= this->width_blur;
        local_64 = local_64 + 1) {
      pfVar1 = ConvolutionFilter::operator[](&this->filter_blur_x,0);
      fVar3 = local_48;
      iVar2 = local_64 + this->width_blur;
      pfVar1[iVar2] = pfVar1[iVar2] / fVar4;
      pfVar1 = ConvolutionFilter::operator[](&this->filter_blur_y,local_64 + this->width_blur);
      *pfVar1 = *pfVar1 / fVar3;
    }
    _offset_local.x._3_1_ = true;
  }
  return _offset_local.x._3_1_;
}

Assistant:

bool FontEffectGlow::Initialise(int _width_outline, int _width_blur, Vector2i _offset)
{
	if (_width_outline < 0 || _width_blur < 0)
		return false;

	width_outline = _width_outline;
	width_blur = _width_blur;
	combined_width = width_blur + width_outline;
	offset = _offset;

	// Outline filter.
	filter_outline.Initialise(width_outline, FilterOperation::Dilation);
	for (int x = -width_outline; x <= width_outline; ++x)
	{
		for (int y = -width_outline; y <= width_outline; ++y)
		{
			float weight = 1;

			float distance = Math::SquareRoot(float(x * x + y * y));
			if (distance > width_outline)
			{
				weight = (width_outline + 1) - distance;
				weight = Math::Max(weight, 0.0f);
			}

			filter_outline[x + width_outline][y + width_outline] = weight;
		}
	}

	// Gaussian blur filter
	const float std_dev = (width_blur == 0 ? 1.f : .4f * float(width_blur));
	const float two_variance = 2.f * std_dev * std_dev;
	const float gain = 1.f / Math::SquareRoot(Math::RMLUI_PI * two_variance);

	float sum_weight = 0.f;

	// We separate the blur filter into two passes, horizontal and vertical, for performance reasons.
	filter_blur_x.Initialise(Vector2i(width_blur, 0), FilterOperation::Sum);
	filter_blur_y.Initialise(Vector2i(0, width_blur), FilterOperation::Sum);

	for (int x = -width_blur; x <= width_blur; ++x)
	{
		float weight = gain * Math::Exp(-Math::SquareRoot(float(x * x) / two_variance));

		filter_blur_x[0][x + width_blur] = weight;
		filter_blur_y[x + width_blur][0] = weight;
		sum_weight += weight;
	}

	// Normalize the kernels
	for (int x = -width_blur; x <= width_blur; ++x)
	{
		filter_blur_x[0][x + width_blur] /= sum_weight;
		filter_blur_y[x + width_blur][0] /= sum_weight;
	}

	return true;
}